

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bench.cc
# Opt level: O3

Timer _fill_random2<phmap::parallel_flat_hash_map<long,long,phmap::Hash<long>,phmap::EqualTo<long>,std::allocator<std::pair<long_const,long>>,4ul,phmap::NullMutex>>
                (int64_t cnt,
                parallel_flat_hash_map<long,_long,_phmap::Hash<long>,_phmap::EqualTo<long>,_std::allocator<std::pair<const_long,_long>_>,_4UL,_phmap::NullMutex>
                *hash)

{
  bool bVar1;
  char *pcVar2;
  size_t sz;
  time_point tVar3;
  long lVar4;
  uint64_t uVar5;
  array<phmap::priv::parallel_hash_set<4UL,_phmap::priv::raw_hash_set,_phmap::NullMutex,_phmap::priv::FlatHashMapPolicy<long,_long>,_phmap::Hash<long>,_phmap::EqualTo<long>,_std::allocator<std::pair<const_long,_long>_>_>::Inner,_16UL>
  *__range3;
  long lVar6;
  long lVar7;
  undefined1 auVar8 [16];
  RSU rsu;
  
  rsu.m_index = 0x3f477ec8;
  rsu.m_intermediateOffset = 0x98d6e455;
  tVar3.__d.__r = (duration)std::chrono::_V2::system_clock::now();
  inner_cnt = cnt / 10;
  s_num_keys[0] = 0;
  s_num_keys[1] = 0;
  s_num_keys[2] = 0;
  s_num_keys[3] = 0;
  s_num_keys[4] = 0;
  s_num_keys[5] = 0;
  s_num_keys[6] = 0;
  s_num_keys[7] = 0;
  s_num_keys[8] = 0;
  s_num_keys[9] = 0;
  s_num_keys[10] = 0;
  s_num_keys[0xb] = 0;
  s_num_keys[0xc] = 0;
  s_num_keys[0xd] = 0;
  s_num_keys[0xe] = 0;
  s_num_keys[0xf] = 0;
  loop_idx = 0;
  do {
    _fill_random_inner_mt<phmap::parallel_flat_hash_map<long,long,phmap::Hash<long>,phmap::EqualTo<long>,std::allocator<std::pair<long_const,long>>,4ul,phmap::NullMutex>>
              (inner_cnt,hash,&rsu);
    pcVar2 = program_slug;
    lVar4 = 0;
    lVar6 = 0;
    lVar7 = 0;
    do {
      lVar6 = lVar6 + *(long *)((long)s_num_keys + lVar4);
      lVar7 = lVar7 + *(long *)((long)s_num_keys + lVar4 + 8);
      lVar4 = lVar4 + 0x10;
    } while (lVar4 != 0x80);
    lVar4 = std::chrono::_V2::system_clock::now();
    printf("%s,time,%u,%s,%f\n",
           (double)(float)((double)((lVar4 - (long)tVar3.__d.__r) / 1000000) / 1000.0),"random",
           lVar7 + lVar6 & 0xffffffff,pcVar2);
    lVar4 = loop_idx + 1;
    bVar1 = loop_idx < 9;
    loop_idx = lVar4;
  } while (bVar1);
  lVar4 = 0x10;
  lVar6 = 0;
  do {
    lVar6 = lVar6 + *(long *)((long)&(hash->
                                     super_parallel_hash_map<4UL,_phmap::priv::raw_hash_set,_phmap::NullMutex,_phmap::priv::FlatHashMapPolicy<long,_long>,_phmap::Hash<long>,_phmap::EqualTo<long>,_std::allocator<std::pair<const_long,_long>_>_>
                                     ).
                                     super_parallel_hash_set<4UL,_phmap::priv::raw_hash_set,_phmap::NullMutex,_phmap::priv::FlatHashMapPolicy<long,_long>,_phmap::Hash<long>,_phmap::EqualTo<long>,_std::allocator<std::pair<const_long,_long>_>_>
                                     .sets_._M_elems[0].set_.ctrl_ + lVar4);
    lVar4 = lVar4 + 0x30;
  } while (lVar4 != 0x310);
  auVar8._8_4_ = (int)((ulong)lVar6 >> 0x20);
  auVar8._0_8_ = lVar6;
  auVar8._12_4_ = 0x45300000;
  fprintf(_stderr,"inserted %.2lfM\n",
          ((auVar8._8_8_ - 1.9342813113834067e+25) +
          ((double)CONCAT44(0x43300000,(int)lVar6) - 4503599627370496.0)) / 1000000.0);
  lVar6 = 0;
  lVar7 = 0;
  lVar4 = 0;
  do {
    lVar6 = lVar6 + *(long *)((long)s_num_keys + lVar4);
    lVar7 = lVar7 + *(long *)((long)s_num_keys + lVar4 + 8);
    lVar4 = lVar4 + 0x10;
  } while (lVar4 != 0x80);
  uVar5 = spp::GetProcessMemoryUsed();
  if (outmem::max_mem < uVar5) {
    outmem::max_mem = uVar5;
  }
  if (outmem::max_keys < (ulong)(lVar7 + lVar6)) {
    outmem::max_keys = lVar7 + lVar6;
  }
  return (Timer)(rep)tVar3.__d.__r;
}

Assistant:

Timer _fill_random2(int64_t cnt, HT &hash)
{
    test = "random";
    unsigned int seed = 76687;
	RSU rsu(seed, seed + 1);

    Timer timer(true);
    const int64_t num_loops = 10;
    inner_cnt = cnt / num_loops;

    for (int i=0; i<16; ++i)
        s_num_keys[i] = 0;

    for (loop_idx=0; loop_idx<num_loops; ++loop_idx)
    {
#if 1 && MT_SUPPORT
        // multithreaded insert
        _fill_random_inner_mt(inner_cnt, hash, rsu);
#else
        _fill_random_inner(inner_cnt, hash, rsu);
#endif
        out(test, total_num_keys(), timer);
    }
    fprintf(stderr, "inserted %.2lfM\n", (double)hash.size() / 1000000);
    outmem(test, total_num_keys(), spp::GetProcessMemoryUsed());
    return timer;
}